

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_eh.h
# Opt level: O2

uint64_t read_value(char encoding,uchar **data)

{
  uint64_t uVar1;
  uint *puVar2;
  ushort *puVar3;
  uint64_t *puVar4;
  
  switch(encoding & 0xf) {
  case 0:
  case 4:
  case 0xc:
    uVar1 = *(uint64_t *)*data;
    puVar4 = (uint64_t *)((long)*data + 8);
    goto LAB_00116ce5;
  case 1:
    uVar1 = read_uleb128(data);
    return uVar1;
  case 2:
    puVar3 = (ushort *)*data;
    uVar1 = (uint64_t)*puVar3;
    break;
  case 3:
    puVar2 = (uint *)*data;
    uVar1 = (uint64_t)*puVar2;
    goto LAB_00116ccc;
  default:
    abort();
  case 9:
    uVar1 = read_sleb128(data);
    return uVar1;
  case 10:
    puVar3 = (ushort *)*data;
    uVar1 = (uint64_t)(short)*puVar3;
    break;
  case 0xb:
    puVar2 = (uint *)*data;
    uVar1 = (uint64_t)(int)*puVar2;
LAB_00116ccc:
    puVar4 = (uint64_t *)(puVar2 + 1);
    goto LAB_00116ce5;
  }
  puVar4 = (uint64_t *)(puVar3 + 1);
LAB_00116ce5:
  *data = (uchar *)puVar4;
  return uVar1;
}

Assistant:

static uint64_t read_value(char encoding, unsigned char **data)
{
	enum dwarf_data_encoding type = get_encoding(encoding);
	uint64_t v;
	switch ((int)type)
	{
		// Read fixed-length types
#define READ(dwarf, type) \
		case dwarf:\
			v = (uint64_t)(*(type*)(*data));\
			*data += sizeof(type);\
			break;
		READ(DW_EH_PE_udata2, uint16_t)
		READ(DW_EH_PE_udata4, uint32_t)
		READ(DW_EH_PE_udata8, uint64_t)
		READ(DW_EH_PE_sdata2, int16_t)
		READ(DW_EH_PE_sdata4, int32_t)
		READ(DW_EH_PE_sdata8, int64_t)
		case DW_EH_PE_absptr:
			v = (uint64_t)(*(intptr_t*)(*data));
			*data += sizeof(intptr_t);
			break;
		//READ(DW_EH_PE_absptr, intptr_t)
#undef READ
		case DW_EH_PE_sleb128:
			v = read_sleb128(data);
			break;
		case DW_EH_PE_uleb128:
			v = read_uleb128(data);
			break;
		default: abort();
	}

	return v;
}